

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateSequence(ExpressionTranslateContext *ctx,ExprSequence *expression)

{
  uint uVar1;
  char *format;
  ulong uVar2;
  
  if ((expression->expressions).count == 0) {
    format = "/*empty sequence*/";
  }
  else {
    Print(ctx,"(");
    OutputContext::Print(ctx->output,"\n",1);
    uVar1 = ctx->depth;
    ctx->depth = uVar1 + 1;
    if ((expression->expressions).count != 0) {
      uVar2 = 0;
      do {
        PrintIndent(ctx);
        if ((expression->expressions).count <= uVar2) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<ExprBase *, 4>::operator[](unsigned int) [T = ExprBase *, N = 4]"
                       );
        }
        Translate(ctx,(expression->expressions).data[uVar2]);
        uVar2 = uVar2 + 1;
        if (uVar2 < (expression->expressions).count) {
          Print(ctx,", ");
        }
        OutputContext::Print(ctx->output,"\n",1);
      } while (uVar2 < (expression->expressions).count);
      uVar1 = ctx->depth - 1;
    }
    ctx->depth = uVar1;
    PrintIndent(ctx);
    format = ")";
  }
  Print(ctx,format);
  return;
}

Assistant:

void TranslateSequence(ExpressionTranslateContext &ctx, ExprSequence *expression)
{
	if(expression->expressions.empty())
	{
		Print(ctx, "/*empty sequence*/");
		return;
	}

	Print(ctx, "(");
	PrintLine(ctx);

	ctx.depth++;

	for(unsigned i = 0; i < expression->expressions.size(); i++)
	{
		PrintIndent(ctx);

		Translate(ctx, expression->expressions[i]);

		if(i + 1 < expression->expressions.size())
			Print(ctx, ", ");

		PrintLine(ctx);
	}

	ctx.depth--;

	PrintIndent(ctx);
	Print(ctx, ")");
}